

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::internal::MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::
~MatcherBase(MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }